

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprVariableDefinition *
CreateFunctionContextArgument(ExpressionContext *ctx,SynBase *source,FunctionData *function)

{
  uint uniqueId;
  Lexeme *allocator;
  ScopeData *scope;
  TypeBase *type_00;
  FunctionData *source_00;
  VariableData *this;
  ExprVariableDefinition *this_00;
  VariableHandle *this_01;
  char *strBegin;
  InplaceStr local_50;
  SynIdentifier *local_40;
  SynIdentifier *nameIdentifier;
  TypeBase *pTStack_30;
  uint offset;
  TypeBase *type;
  FunctionData *function_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  pTStack_30 = function->contextType;
  type = (TypeBase *)function;
  function_local = (FunctionData *)source;
  source_local = (SynBase *)ctx;
  if (((pTStack_30->isGeneric ^ 0xffU) & 1) == 0) {
    __assert_fail("!type->isGeneric",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x21c9,
                  "ExprVariableDefinition *CreateFunctionContextArgument(ExpressionContext &, SynBase *, FunctionData *)"
                 );
  }
  nameIdentifier._4_4_ = anon_unknown.dwarf_8df1c::AllocateArgumentInScope(ctx,source,0,pTStack_30);
  local_40 = ExpressionContext::get<SynIdentifier>((ExpressionContext *)source_local);
  strBegin = "$context";
  if (*(long *)((type->name).end + 0x20) != 0) {
    strBegin = "this";
  }
  InplaceStr::InplaceStr(&local_50,strBegin);
  SynIdentifier::SynIdentifier(local_40,local_50);
  this = ExpressionContext::get<VariableData>((ExpressionContext *)source_local);
  allocator = source_local[0x229].begin;
  scope = (ScopeData *)source_local[0x205].end;
  uniqueId = *(uint *)((long)&source_local[0x228].next + 4);
  *(uint *)((long)&source_local[0x228].next + 4) = uniqueId + 1;
  VariableData::VariableData
            (this,(Allocator *)allocator,(SynBase *)function_local,scope,0,pTStack_30,local_40,
             nameIdentifier._4_4_,uniqueId);
  type[5].importModule = (ModuleData *)this;
  ExpressionContext::AddVariable
            ((ExpressionContext *)source_local,(VariableData *)type[5].importModule,true);
  if (0xffff < (long)((type[4].unsizedArrayType)->super_TypeStruct).super_TypeBase.refType) {
    anon_unknown.dwarf_8df1c::Report
              ((ExpressionContext *)source_local,(SynBase *)function_local,
               "ERROR: function argument size cannot exceed 65536");
  }
  if (0xffff < *(long *)(*(long *)(*(long *)&type->typeIndex + 0x60) + 0x30)) {
    anon_unknown.dwarf_8df1c::Report
              ((ExpressionContext *)source_local,(SynBase *)function_local,
               "ERROR: function return size cannot exceed 65536");
  }
  this_00 = ExpressionContext::get<ExprVariableDefinition>((ExpressionContext *)source_local);
  source_00 = function_local;
  type_00 = *(TypeBase **)&source_local[0x226].listed;
  this_01 = ExpressionContext::get<VariableHandle>((ExpressionContext *)source_local);
  VariableHandle::VariableHandle(this_01,(SynBase *)0x0,(VariableData *)type[5].importModule);
  ExprVariableDefinition::ExprVariableDefinition
            (this_00,(SynBase *)source_00,type_00,this_01,(ExprBase *)0x0);
  return this_00;
}

Assistant:

ExprVariableDefinition* CreateFunctionContextArgument(ExpressionContext &ctx, SynBase *source, FunctionData *function)
{
	TypeBase *type = function->contextType;

	assert(!type->isGeneric);

	unsigned offset = AllocateArgumentInScope(ctx, source, 0, type);

	SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr(function->scope->ownerType ? "this" : "$context"));

	function->contextArgument = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, type, nameIdentifier, offset, ctx.uniqueVariableId++);

	ctx.AddVariable(function->contextArgument, true);

	if(function->functionScope->dataSize >= 65536)
		Report(ctx, source, "ERROR: function argument size cannot exceed 65536");

	if(function->type->returnType->size >= 65536)
		Report(ctx, source, "ERROR: function return size cannot exceed 65536");

	return new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(source, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, function->contextArgument), NULL);
}